

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_wiener_var_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  int iVar1;
  AV1_COMMON *cm;
  long lVar2;
  long *plVar3;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  undefined4 in_stack_ffffffffffffffd8;
  
  cm = (AV1_COMMON *)(in_RDI + 0x9ae48);
  for (iVar1 = in_EDX + -1; -1 < iVar1; iVar1 = iVar1 + -1) {
    lVar2 = *(long *)&cm->width + (long)iVar1 * 0x38;
    plVar3 = (long *)(*(long *)&cm->render_width + (long)iVar1 * 0x1d0);
    *(undefined8 *)(lVar2 + 0x18) = in_RSI;
    *(long **)(lVar2 + 0x20) = plVar3;
    *(undefined8 *)(lVar2 + 0x28) = 0;
    *(int *)((long)plVar3 + 0x1cc) = iVar1;
    *(undefined4 *)(plVar3 + 0x39) = 0;
    *plVar3 = in_RDI;
    if (iVar1 == 0) {
      plVar3[1] = in_RDI + 0x15030;
    }
    else {
      plVar3[1] = plVar3[2];
    }
    if (plVar3[1] != in_RDI + 0x15030) {
      memcpy((void *)plVar3[1],(void *)(in_RDI + 0x15030),0x256b0);
      av1_alloc_mb_wiener_var_pred_buf
                (cm,(ThreadData_conflict *)CONCAT44(iVar1,in_stack_ffffffffffffffd8));
    }
  }
  return;
}

Assistant:

static inline void prepare_wiener_var_workers(AV1_COMP *const cpi,
                                              AVxWorkerHook hook,
                                              const int num_workers) {
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    EncWorkerData *const thread_data = &mt_info->tile_thr_data[i];

    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = NULL;

    thread_data->thread_id = i;
    // Set the starting tile for each thread, in this case the preprocessing
    // stage does not need tiles. So we set it to 0.
    thread_data->start = 0;

    thread_data->cpi = cpi;
    if (i == 0) {
      thread_data->td = &cpi->td;
    } else {
      thread_data->td = thread_data->original_td;
    }

    if (thread_data->td != &cpi->td) {
      thread_data->td->mb = cpi->td.mb;
      av1_alloc_mb_wiener_var_pred_buf(&cpi->common, thread_data->td);
    }
  }
}